

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall
icu_63::RBBITableBuilder::buildSafeReverseTable(RBBITableBuilder *this,UErrorCode *status)

{
  char16_t cVar1;
  char16_t cVar2;
  uint capacity;
  undefined4 uVar3;
  ulong uVar4;
  void *pvVar5;
  UVector *pUVar6;
  UnicodeString *pUVar7;
  UnicodeString *this_00;
  int32_t startState;
  int index;
  int iVar8;
  int32_t index_00;
  code *this_01;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int32_t charClass;
  int iVar12;
  bool bVar13;
  bool bVar14;
  IntPair states;
  UnicodeString safePairs;
  
  safePairs.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0024c170;
  safePairs.fUnion.fStackFields.fLengthAndFlags = 2;
  this_01 = (code *)status;
  capacity = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar8 = this->fDStates->count;
  uVar11 = 0;
  uVar4 = 0;
  if (0 < (int)capacity) {
    uVar4 = (ulong)capacity;
  }
  do {
    if (uVar11 == uVar4) {
      pUVar6 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)this_01);
      iVar8 = capacity + 2;
      if (pUVar6 != (UVector *)0x0) {
        this_01 = uprv_deleteUObject_63;
        UVector::UVector(pUVar6,uprv_deleteUObject_63,uhash_compareUnicodeString_63,iVar8,status);
      }
      this->fSafeTable = pUVar6;
      iVar12 = 0;
      if (0 < iVar8) {
        iVar12 = iVar8;
      }
      while( true ) {
        pUVar6 = this->fSafeTable;
        if (iVar12 == 0) break;
        this_01 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_01);
        if ((UnicodeString *)this_01 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString((UnicodeString *)this_01,capacity,0,capacity + 4);
        }
        UVector::addElement(pUVar6,this_01,status);
        iVar12 = iVar12 + -1;
      }
      pUVar7 = (UnicodeString *)UVector::elementAt(pUVar6,1);
      for (iVar12 = 0; (int)uVar4 != iVar12; iVar12 = iVar12 + 1) {
        UnicodeString::setCharAt(pUVar7,iVar12,(short)iVar12 + L'\x02');
      }
      for (index_00 = 2; index_00 < iVar8; index_00 = index_00 + 1) {
        this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,index_00);
        UnicodeString::operator=(this_00,pUVar7);
      }
      iVar8 = 0;
      while( true ) {
        uVar3 = safePairs.fUnion.fFields.fLength;
        if (-1 < safePairs.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)safePairs.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if ((int)uVar3 <= iVar8) break;
        cVar1 = UnicodeString::doCharAt(&safePairs,iVar8);
        cVar2 = UnicodeString::doCharAt(&safePairs,iVar8 + 1);
        pUVar7 = (UnicodeString *)UVector::elementAt(this->fSafeTable,(ushort)cVar2 + 2);
        UnicodeString::setCharAt(pUVar7,(uint)(ushort)cVar1,L'\0');
        iVar8 = iVar8 + 2;
      }
      states.first = 1;
      states.second = 0;
      while (bVar13 = findDuplicateSafeState(this,&states), bVar13) {
        removeSafeState(this,states);
      }
      UnicodeString::~UnicodeString(&safePairs);
      return;
    }
    for (uVar10 = 0; uVar10 != capacity; uVar10 = uVar10 + 1) {
      iVar12 = 0;
      index = 1;
      iVar9 = -1;
      do {
        if (iVar8 <= index) break;
        pvVar5 = UVector::elementAt(this->fDStates,index);
        this_01 = (code *)0x0;
        if ((long)uVar11 < (long)*(int *)(*(long *)((long)pvVar5 + 0x28) + 8)) {
          this_01 = (code *)(ulong)*(uint *)(*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x18) +
                                            uVar11 * 4);
        }
        pvVar5 = UVector::elementAt(this->fDStates,(int32_t)this_01);
        iVar12 = 0;
        if ((long)uVar10 < (long)*(int *)(*(long *)((long)pvVar5 + 0x28) + 8)) {
          iVar12 = *(int *)(*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x18) + uVar10 * 4);
        }
        bVar13 = iVar9 == iVar12;
        bVar14 = iVar9 < 0;
        if (bVar14) {
          iVar9 = iVar12;
        }
        index = index + 1;
      } while (bVar14 || bVar13);
      if (iVar9 == iVar12) {
        UnicodeString::append(&safePairs,(char16_t)uVar11);
        this_01 = (code *)(uVar10 & 0xffff);
        UnicodeString::append(&safePairs,(char16_t)uVar10);
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void RBBITableBuilder::buildSafeReverseTable(UErrorCode &status) {
    // The safe table creation has three steps:

    // 1. Identifiy pairs of character classes that are "safe." Safe means that boundaries
    // following the pair do not depend on context or state before the pair. To test
    // whether a pair is safe, run it through the main forward state table, starting
    // from each state. If the the final state is the same, no matter what the starting state,
    // the pair is safe.
    //
    // 2. Build a state table that recognizes the safe pairs. It's similar to their
    // forward table, with a column for each input character [class], and a row for
    // each state. Row 1 is the start state, and row 0 is the stop state. Initially
    // create an additional state for each input character category; being in
    // one of these states means that the character has been seen, and is potentially
    // the first of a pair. In each of these rows, the entry for the second character
    // of a safe pair is set to the stop state (0), indicating that a match was found.
    // All other table entries are set to the state corresponding the current input
    // character, allowing that charcter to be the of a start following pair.
    //
    // Because the safe rules are to be run in reverse, moving backwards in the text,
    // the first and second pair categories are swapped when building the table.
    //
    // 3. Compress the table. There are typically many rows (states) that are
    // equivalent - that have zeroes (match completed) in the same columns -
    // and can be folded together.

    // Each safe pair is stored as two UChars in the safePair string.
    UnicodeString safePairs;

    int32_t numCharClasses = fRB->fSetBuilder->getNumCharCategories();
    int32_t numStates = fDStates->size();

    for (int32_t c1=0; c1<numCharClasses; ++c1) {
        for (int32_t c2=0; c2 < numCharClasses; ++c2) {
            int32_t wantedEndState = -1;
            int32_t endState = 0;
            for (int32_t startState = 1; startState < numStates; ++startState) {
                RBBIStateDescriptor *startStateD = static_cast<RBBIStateDescriptor *>(fDStates->elementAt(startState));
                int32_t s2 = startStateD->fDtran->elementAti(c1);
                RBBIStateDescriptor *s2StateD = static_cast<RBBIStateDescriptor *>(fDStates->elementAt(s2));
                endState = s2StateD->fDtran->elementAti(c2);
                if (wantedEndState < 0) {
                    wantedEndState = endState;
                } else {
                    if (wantedEndState != endState) {
                        break;
                    }
                }
            }
            if (wantedEndState == endState) {
                safePairs.append((char16_t)c1);
                safePairs.append((char16_t)c2);
                // printf("(%d, %d) ", c1, c2);
            }
        }
        // printf("\n");
    }

    // Populate the initial safe table.
    // The table as a whole is UVector<UnicodeString>
    // Each row is represented by a UnicodeString, being used as a Vector<int16>.
    // Row 0 is the stop state.
    // Row 1 is the start sate.
    // Row 2 and beyond are other states, initially one per char class, but
    //   after initial construction, many of the states will be combined, compacting the table.
    // The String holds the nextState data only. The four leading fields of a row, fAccepting,
    // fLookAhead, etc. are not needed for the safe table, and are omitted at this stage of building.

    U_ASSERT(fSafeTable == nullptr);
    fSafeTable = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, numCharClasses + 2, status);
    for (int32_t row=0; row<numCharClasses + 2; ++row) {
        fSafeTable->addElement(new UnicodeString(numCharClasses, 0, numCharClasses+4), status);
    }

    // From the start state, each input char class transitions to the state for that input.
    UnicodeString &startState = *static_cast<UnicodeString *>(fSafeTable->elementAt(1));
    for (int32_t charClass=0; charClass < numCharClasses; ++charClass) {
        // Note: +2 for the start & stop state.
        startState.setCharAt(charClass, static_cast<char16_t>(charClass+2));
    }

    // Initially make every other state table row look like the start state row,
    for (int32_t row=2; row<numCharClasses+2; ++row) {
        UnicodeString &rowState = *static_cast<UnicodeString *>(fSafeTable->elementAt(row));
        rowState = startState;   // UnicodeString assignment, copies contents.
    }

    // Run through the safe pairs, set the next state to zero when pair has been seen.
    // Zero being the stop state, meaning we found a safe point.
    for (int32_t pairIdx=0; pairIdx<safePairs.length(); pairIdx+=2) {
        int32_t c1 = safePairs.charAt(pairIdx);
        int32_t c2 = safePairs.charAt(pairIdx + 1);

        UnicodeString &rowState = *static_cast<UnicodeString *>(fSafeTable->elementAt(c2 + 2));
        rowState.setCharAt(c1, 0);
    }

    // Remove duplicate or redundant rows from the table.
    IntPair states = {1, 0};
    while (findDuplicateSafeState(&states)) {
        // printf("Removing duplicate safe states (%d, %d)\n", states.first, states.second);
        removeSafeState(states);
    }
}